

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlcat.c
# Opt level: O0

unsigned_long strlcat(char *dst,char *src,size_t siz)

{
  long lVar1;
  size_t sVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  size_t dlen;
  size_t n;
  char *s;
  char *d;
  long local_38;
  char *local_30;
  char *local_28;
  unsigned_long local_8;
  
  local_38 = in_RDX;
  local_28 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (local_38 != 0) {
      bVar3 = *local_28 != '\0';
    }
    if (!bVar3) break;
    local_28 = local_28 + 1;
    local_38 = local_38 + -1;
  }
  lVar1 = (long)local_28 - (long)in_RDI;
  local_38 = in_RDX - lVar1;
  local_30 = in_RSI;
  if (local_38 == 0) {
    sVar2 = strlen(in_RSI);
  }
  else {
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (local_38 != 1) {
        *local_28 = *local_30;
        local_38 = local_38 + -1;
        local_28 = local_28 + 1;
      }
    }
    *local_28 = '\0';
    sVar2 = (long)local_30 - (long)in_RSI;
  }
  local_8 = lVar1 + sVar2;
  return local_8;
}

Assistant:

size_t
strlcat(char *dst, const char *src, size_t siz)
{
	char *d = dst;
	const char *s = src;
	size_t n = siz;
	size_t dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (n-- != 0 && *d != '\0')
		d++;
	dlen = d - dst;
	n = siz - dlen;

	if (n == 0)
		return(dlen + strlen(s));
	while (*s != '\0') {
		if (n != 1) {
			*d++ = *s;
			n--;
		}
		s++;
	}
	*d = '\0';

	return(dlen + (s - src));	/* count does not include NUL */
}